

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O2

void * __thiscall
kj::anon_unknown_8::DiskHandle::mmap
          (DiskHandle *this,void *__addr,size_t __len,int __prot,int __flags,int __fd,
          __off_t __offset)

{
  void *pvVar1;
  int *piVar2;
  UnwindDetector in_register_0000000c;
  DiskHandle size;
  MmapRange MVar3;
  Fault f;
  
  size.fd.unwindDetector.uncaughtCount = in_register_0000000c.uncaughtCount;
  size.fd.fd = __prot;
  MVar3 = getMmapRange(__len,(uint64_t)size.fd);
  pvVar1 = ::mmap((void *)0x0,MVar3.size,1,1,*__addr,MVar3.offset);
  if (pvVar1 != (void *)0xffffffffffffffff) {
    this->fd = (AutoCloseFd)((long)pvVar1 + (__len - MVar3.offset));
    this[1].fd = size.fd;
    this[2].fd = (AutoCloseFd)&(anonymous_namespace)::mmapDisposer;
    return this;
  }
  piVar2 = __errno_location();
  kj::_::Debug::Fault::Fault
            (&f,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
             ,0x160,*piVar2,"mmap","");
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

Array<const byte> mmap(uint64_t offset, uint64_t size) const {
    auto range = getMmapRange(offset, size);
    const void* mapping = ::mmap(NULL, range.size, PROT_READ, MAP_SHARED, fd, range.offset);
    if (mapping == MAP_FAILED) {
      KJ_FAIL_SYSCALL("mmap", errno);
    }
    return Array<const byte>(reinterpret_cast<const byte*>(mapping) + (offset - range.offset),
                             size, mmapDisposer);
  }